

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetSegwitAddressByHash_Test::TestBody
          (AddressFactory_GetSegwitAddressByHash_Test *this)

{
  bool bVar1;
  char *pcVar2;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  AddressFactory factory;
  Address *in_stack_fffffffffffff9a8;
  allocator *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bc;
  undefined1 in_stack_fffffffffffff9bd;
  undefined1 in_stack_fffffffffffff9be;
  undefined1 in_stack_fffffffffffff9bf;
  char *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  AssertHelper local_618;
  Message local_610 [2];
  allocator local_5f9;
  string local_5f8 [32];
  ByteData local_5d8;
  ByteData local_5c0 [15];
  byte local_441;
  ConstCharPtr local_440;
  AssertHelper local_438;
  Message local_430 [3];
  ByteData local_418;
  ByteData local_400 [15];
  byte local_281;
  ConstCharPtr local_280;
  AssertHelper local_278;
  Message local_270;
  undefined4 local_268;
  AddressType local_264;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248 [4];
  string local_228 [32];
  AssertionResult local_208 [2];
  allocator local_1e1;
  string local_1e0 [32];
  ByteData local_1c0;
  ByteData local_1a8 [15];
  AddressFactory local_30;
  
  cfd::AddressFactory::AddressFactory(&local_30,kRegtest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_1e1);
  cfd::core::ByteData::ByteData(&local_1c0,local_1e0);
  cfd::AddressFactory::GetSegwitAddressByHash(local_1a8);
  cfd::core::ByteData::~ByteData((ByteData *)0x187391);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  cfd::core::Address::GetHash(in_stack_fffffffffffff9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",pcVar2,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string(local_228);
  cfd::core::ByteData::~ByteData((ByteData *)0x187427);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x18754f);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message((Message *)0x1875ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x187604);
  local_264 = cfd::core::Address::GetAddressType((Address *)local_1a8);
  local_268 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((char *)CONCAT44(local_264,in_stack_fffffffffffff9c8),in_stack_fffffffffffff9c0,
             (AddressType *)
             CONCAT17(in_stack_fffffffffffff9bf,
                      CONCAT16(in_stack_fffffffffffff9be,
                               CONCAT15(in_stack_fffffffffffff9bd,
                                        CONCAT14(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8
                                                )))),(AddressType *)in_stack_fffffffffffff9b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1876c3);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x187720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x187778);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_280,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_280);
  if (bVar1) {
    local_281 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData::ByteData(&local_418);
      cfd::AddressFactory::GetSegwitAddressByHash(local_400);
      cfd::core::Address::~Address((Address *)in_stack_fffffffffffff9b0);
      cfd::core::ByteData::~ByteData((ByteData *)0x187816);
    }
    if ((local_281 & 1) == 0) {
      local_280.value =
           "Expected: factory.GetSegwitAddressByHash(ByteData()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001878ee;
    }
  }
  else {
LAB_001878ee:
    testing::Message::Message(local_430);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xf7,local_280.value);
    testing::internal::AssertHelper::operator=(&local_438,local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x187956);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_440,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_440);
  if (bVar1) {
    local_441 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffff9b0 = &local_5f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f8,"0000",in_stack_fffffffffffff9b0);
      cfd::core::ByteData::ByteData(&local_5d8,local_5f8);
      cfd::AddressFactory::GetSegwitAddressByHash(local_5c0);
      cfd::core::Address::~Address((Address *)in_stack_fffffffffffff9b0);
      cfd::core::ByteData::~ByteData((ByteData *)0x187a6b);
      std::__cxx11::string::~string(local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    }
    if ((local_441 & 1) != 0) goto LAB_00187c1a;
    local_440.value =
         "Expected: factory.GetSegwitAddressByHash(ByteData(\"0000\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_610);
  testing::internal::AssertHelper::AssertHelper
            (&local_618,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xf8,local_440.value);
  testing::internal::AssertHelper::operator=(&local_618,local_610);
  testing::internal::AssertHelper::~AssertHelper(&local_618);
  testing::Message::~Message((Message *)0x187bd8);
LAB_00187c1a:
  cfd::core::Address::~Address((Address *)in_stack_fffffffffffff9b0);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x187c34);
  return;
}

Assistant:

TEST(AddressFactory, GetSegwitAddressByHash)
{
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.GetSegwitAddressByHash(ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);

    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData()), CfdException);
    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData("0000")), CfdException);
  }
}